

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_environment_lookContinueTargetRecursively
          (sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,environment,(context->roots).analysisAndEvaluationEnvironmentType);
  if (_Var1) {
    sVar2 = *(sysbvm_tuple_t *)(environment + 0x70);
    if (sVar2 == 0) {
      sVar2 = sysbvm_environment_lookReturnTargetRecursively
                        (context,*(sysbvm_tuple_t *)(environment + 0x30));
      return sVar2;
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_lookContinueTargetRecursively(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        return SYSBVM_NULL_TUPLE;

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(environmentObject->continueTarget)
        return environmentObject->continueTarget;

    return sysbvm_environment_lookReturnTargetRecursively(context, environmentObject->super.parent);
}